

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O1

Edges * __thiscall
graphics101::HalfEdgeTriMesh::boundary_edges(Edges *__return_storage_ptr__,HalfEdgeTriMesh *this)

{
  pointer *ppvVar1;
  iterator __position;
  Edge in_RAX;
  pointer pHVar2;
  ulong uVar3;
  long lVar4;
  HalfEdgeIndex he_index;
  Edge de;
  Edge local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar2 = (this->m_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_halfedges).
      super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar2) {
    lVar4 = 8;
    he_index.value = 0;
    local_38 = in_RAX;
    do {
      if (*(long *)((long)&pHVar2->to_vertex + lVar4) == -1) {
        local_38 = he_index2directed_edge(this,he_index);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<2,int,(glm::qualifier)0>,std::allocator<glm::vec<2,int,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,int,(glm::qualifier)0>const&>
                    ((vector<glm::vec<2,int,(glm::qualifier)0>,std::allocator<glm::vec<2,int,(glm::qualifier)0>>>
                      *)__return_storage_ptr__,__position,&local_38);
        }
        else {
          (__position._M_current)->field_0 = local_38.field_0;
          (__position._M_current)->field_1 = local_38.field_1;
          ppvVar1 = &(__return_storage_ptr__->
                     super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
      }
      he_index.value = he_index.value + 1;
      pHVar2 = (this->m_halfedges).
               super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->m_halfedges).
                     super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2 >> 3) *
              -0x3333333333333333;
      lVar4 = lVar4 + 0x28;
    } while ((ulong)he_index.value <= uVar3 && uVar3 - he_index.value != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

HalfEdgeTriMesh::Edges HalfEdgeTriMesh::boundary_edges() const
{
    Edges result;
    for( int hei = 0; hei < m_halfedges.size(); ++hei )
    {
        const HalfEdge& he = halfedge( HalfEdgeIndex( hei ) );

        if( -1 == he.face )
        {
            const auto de = he_index2directed_edge( HalfEdgeIndex( hei ) );
            result.push_back( de );
        }
    }

    return result;
}